

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbest_generator.cpp
# Opt level: O0

bool __thiscall MeCab::NBestGenerator::set(NBestGenerator *this,Lattice *lattice)

{
  bool bVar1;
  int iVar2;
  QueueElement *pQVar3;
  undefined4 extraout_var;
  FreeList<MeCab::NBestGenerator::QueueElement> *in_RSI;
  value_type *in_RDI;
  priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
  *unaff_retaddr;
  QueueElement *eos;
  
  FreeList<MeCab::NBestGenerator::QueueElement>::free
            ((FreeList<MeCab::NBestGenerator::QueueElement> *)(in_RDI + 5),in_RSI);
  while( true ) {
    bVar1 = std::
            priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
            ::empty((priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
                     *)0x17916f);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
    ::pop((priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
           *)in_RSI);
  }
  pQVar3 = FreeList<MeCab::NBestGenerator::QueueElement>::alloc(in_RSI);
  iVar2 = (*in_RSI->_vptr_FreeList[3])();
  pQVar3->node = (Node *)CONCAT44(extraout_var,iVar2);
  pQVar3->next = (QueueElement *)0x0;
  pQVar3->gx = 0;
  pQVar3->fx = 0;
  std::
  priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
  ::push(unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool NBestGenerator::set(Lattice *lattice) {
  freelist_.free();
  while (!agenda_.empty()) {
    agenda_.pop();   // make empty
  }
  QueueElement *eos = freelist_.alloc();
  eos->node = lattice->eos_node();
  eos->next = 0;
  eos->fx = eos->gx = 0;
  agenda_.push(eos);
  return true;
}